

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O2

void oonf_subsystem_hook(oonf_subsystem *plugin)

{
  avl_node *paVar1;
  
  _init_plugin_tree();
  paVar1 = avl_find(&oonf_plugin_tree,plugin->name);
  if (paVar1 != (avl_node *)0x0) {
    return;
  }
  (plugin->_node).key = plugin->name;
  avl_insert(&oonf_plugin_tree,&plugin->_node);
  return;
}

Assistant:

void
oonf_subsystem_hook(struct oonf_subsystem *plugin) {
  /* make sure plugin tree is initialized */
  _init_plugin_tree();

  /* check if plugin is already in tree */
  if (oonf_subsystem_get(plugin->name)) {
    return;
  }

  /* hook plugin into avl tree */
  plugin->_node.key = plugin->name;
  avl_insert(&oonf_plugin_tree, &plugin->_node);
}